

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

int loop(uchar *pattern,uchar *string)

{
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ushort **ppuVar5;
  bool local_161;
  uchar *puStack_158;
  int found;
  uchar *pp;
  uchar local_148 [4];
  int rc;
  uchar charset [271];
  uchar *s;
  uchar *p;
  loop_state state;
  uchar *string_local;
  uchar *pattern_local;
  
  bVar2 = false;
  unique0x1000026e = string;
  memset(local_148,0,0x10f);
  pp._4_4_ = 0;
  s = pattern;
  while( true ) {
    while( true ) {
      while (bVar2) {
        if (bVar2) {
          ppuVar5 = __ctype_b_loc();
          if (((*ppuVar5)[(int)(uint)*s] & 0x4000) == 0) {
            return 2;
          }
          if (*s != *stack0xffffffffffffffc8) {
            return 1;
          }
          bVar2 = false;
          unique0x1000029e = stack0xffffffffffffffc8 + 1;
          s = s + 1;
        }
      }
      if (*s == '*') break;
      if (*s == '?') {
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x4000) == 0) {
          if (*stack0xffffffffffffffc8 == 0) {
            return 1;
          }
          return 2;
        }
        unique0x10000276 = stack0xffffffffffffffc8 + 1;
      }
      else {
        if (*s == '\0') {
          if (*stack0xffffffffffffffc8 == 0) {
            return 0;
          }
          return 1;
        }
        if (*s == '\\') {
          bVar2 = true;
        }
        else if (*s == '[') {
          puStack_158 = s + 1;
          iVar4 = setcharset(&stack0xfffffffffffffea8,local_148);
          if (iVar4 == 0) {
            return 2;
          }
          uVar3 = 0;
          if (local_148[*stack0xffffffffffffffc8] == '\0') {
            if (charset[0xf9] == '\0') {
              if (charset[0xfc] == '\0') {
                if (charset[0xfa] == '\0') {
                  if (charset[0xfb] == '\0') {
                    if (charset[0xfd] == '\0') {
                      if (charset[0x101] == '\0') {
                        if (charset[0x102] == '\0') {
                          if (charset[0xff] == '\0') {
                            if (charset[0xfe] == '\0') {
                              if (charset[0x100] != '\0') {
                                ppuVar5 = __ctype_b_loc();
                                uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x8000;
                              }
                            }
                            else {
                              local_161 = true;
                              if (*stack0xffffffffffffffc8 != 0x20) {
                                local_161 = *stack0xffffffffffffffc8 == 9;
                              }
                              uVar3 = (ushort)local_161;
                            }
                          }
                          else {
                            ppuVar5 = __ctype_b_loc();
                            uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x200;
                          }
                        }
                        else {
                          ppuVar5 = __ctype_b_loc();
                          uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x100;
                        }
                      }
                      else {
                        ppuVar5 = __ctype_b_loc();
                        uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x2000;
                      }
                    }
                    else {
                      ppuVar5 = __ctype_b_loc();
                      uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x4000;
                    }
                  }
                  else {
                    ppuVar5 = __ctype_b_loc();
                    uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x1000;
                  }
                }
                else {
                  ppuVar5 = __ctype_b_loc();
                  uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x800;
                }
              }
              else {
                ppuVar5 = __ctype_b_loc();
                uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 0x400;
              }
            }
            else {
              ppuVar5 = __ctype_b_loc();
              uVar3 = (*ppuVar5)[(int)(uint)*stack0xffffffffffffffc8] & 8;
            }
          }
          else {
            uVar3 = 1;
          }
          s = puStack_158;
          if (charset[0xf8] != '\0') {
            uVar3 = (ushort)((uVar3 != 0 ^ 0xffU) & 1);
          }
          if (uVar3 == 0) {
            return 1;
          }
          register0x00000000 = stack0xffffffffffffffc8 + 1;
          memset(local_148,0,0x10f);
        }
        else {
          bVar1 = *stack0xffffffffffffffc8;
          unique0x1000028e = stack0xffffffffffffffc8 + 1;
          if (*s != bVar1) {
            return 1;
          }
        }
      }
      s = s + 1;
    }
    for (; s[1] == '*'; s = s + 1) {
    }
    if ((*stack0xffffffffffffffc8 == 0) && (s[1] == '\0')) {
      return 0;
    }
    pp._4_4_ = loop(s + 1,stack0xffffffffffffffc8);
    if (pp._4_4_ == 0) {
      return 0;
    }
    if (*stack0xffffffffffffffc8 == 0) break;
    register0x00000000 = stack0xffffffffffffffc8 + 1;
  }
  return 1;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string)
{
  loop_state state = CURLFNM_LOOP_DEFAULT;
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };
  int rc = 0;

  for(;;) {
    switch(state) {
    case CURLFNM_LOOP_DEFAULT:
      if(*p == '*') {
        while(*(p+1) == '*') /* eliminate multiple stars */
          p++;
        if(*s == '\0' && *(p+1) == '\0')
          return CURL_FNMATCH_MATCH;
        rc = loop(p + 1, s); /* *.txt matches .txt <=> .txt matches .txt */
        if(rc == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
        if(*s) /* let the star eat up one character */
          s++;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '?') {
        if(ISPRINT(*s)) {
          s++;
          p++;
        }
        else if(*s == '\0')
          return CURL_FNMATCH_NOMATCH;
        else
          return CURL_FNMATCH_FAIL; /* cannot deal with other character */
      }
      else if(*p == '\0') {
        if(*s == '\0')
          return CURL_FNMATCH_MATCH;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else if(*p == '\\') {
        state = CURLFNM_LOOP_BACKSLASH;
        p++;
      }
      else if(*p == '[') {
        unsigned char *pp = p+1; /* cannot handle with pointer to register */
        if(setcharset(&pp, charset)) {
          int found = FALSE;
          if(charset[(unsigned int)*s])
            found = TRUE;
          else if(charset[CURLFNM_ALNUM])
            found = ISALNUM(*s);
          else if(charset[CURLFNM_ALPHA])
            found = ISALPHA(*s);
          else if(charset[CURLFNM_DIGIT])
            found = ISDIGIT(*s);
          else if(charset[CURLFNM_XDIGIT])
            found = ISXDIGIT(*s);
          else if(charset[CURLFNM_PRINT])
            found = ISPRINT(*s);
          else if(charset[CURLFNM_SPACE])
            found = ISSPACE(*s);
          else if(charset[CURLFNM_UPPER])
            found = ISUPPER(*s);
          else if(charset[CURLFNM_LOWER])
            found = ISLOWER(*s);
          else if(charset[CURLFNM_BLANK])
            found = ISBLANK(*s);
          else if(charset[CURLFNM_GRAPH])
            found = ISGRAPH(*s);

          if(charset[CURLFNM_NEGATE])
            found = !found;

          if(found) {
            p = pp+1;
            s++;
            memset(charset, 0, CURLFNM_CHSET_SIZE);
          }
          else
            return CURL_FNMATCH_NOMATCH;
        }
        else
          return CURL_FNMATCH_FAIL;
      }
      else {
        if(*p++ != *s++)
          return CURL_FNMATCH_NOMATCH;
      }
      break;
    case CURLFNM_LOOP_BACKSLASH:
      if(ISPRINT(*p)) {
        if(*p++ == *s++)
          state = CURLFNM_LOOP_DEFAULT;
        else
          return CURL_FNMATCH_NOMATCH;
      }
      else
        return CURL_FNMATCH_FAIL;
      break;
    }
  }
}